

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O2

mdef_t * mdef_init(char *mdeffile,int32 breport)

{
  short sVar1;
  uint uVar2;
  glist_t pgVar3;
  s3cipid_t sVar4;
  s3cipid_t sVar5;
  int32 iVar6;
  int iVar7;
  uint size;
  int iVar8;
  mdef_t *m;
  FILE *pFVar9;
  hash_table_t *phVar10;
  ciphone_t *pcVar11;
  phone_t *ppVar12;
  s3senid_t **ppsVar13;
  s3senid_t *psVar14;
  ph_lc_t ***ppppVar15;
  char *pcVar16;
  s3cipid_t *psVar17;
  void *pvVar18;
  gnode_s *pgVar19;
  word_posn_t wpos;
  FILE *fp;
  FILE *extraout_RDX;
  FILE *extraout_RDX_00;
  FILE *extraout_RDX_01;
  FILE *extraout_RDX_02;
  FILE *extraout_RDX_03;
  FILE *extraout_RDX_04;
  long lVar20;
  FILE *extraout_RDX_05;
  FILE *extraout_RDX_06;
  FILE *extraout_RDX_07;
  FILE *pFVar21;
  FILE *extraout_RDX_08;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  s3pid_t sVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  char *pcVar30;
  size_t __n;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined4 uVar33;
  int32 wlen;
  glist_t local_c68;
  char *local_c60;
  long local_c58;
  FILE *local_c50;
  int32 n;
  char *local_c40;
  char buf [1024];
  undefined4 local_838;
  char tag [1024];
  
  if (mdeffile == (char *)0x0) {
    pcVar16 = "No mdef-file\n";
    lVar20 = 0x2a8;
LAB_001149f3:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
            ,lVar20,pcVar16);
  }
  else {
    if (breport != 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
              ,0x2ab,"Reading model definition: %s\n",mdeffile);
    }
    m = (mdef_t *)
        __ckd_calloc__(1,0x68,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                       ,0x2ad);
    pFVar9 = fopen(mdeffile,"r");
    if (pFVar9 == (FILE *)0x0) {
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                     ,0x2b0,"fopen(%s,r) failed\n",mdeffile);
      goto LAB_001149d5;
    }
    iVar6 = noncomment_line(buf,(int32)pFVar9,fp);
    if (iVar6 < 0) {
      pcVar16 = "Empty file: %s\n";
      lVar20 = 0x2b3;
    }
    else {
      local_c60 = mdeffile;
      iVar7 = bcmp(buf,"0.3",3);
      if (iVar7 != 0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                ,0x2b7,"Version error: Expecing %s, but read %s\n","0.3",buf);
        goto LAB_001149d5;
      }
      m->n_ci_sen = -1;
      m->n_sen = -1;
      m->n_tmat = -1;
      uVar29 = 0xffffffff;
      uVar24 = 0xffffffff;
      local_c68 = (glist_t)CONCAT44(local_c68._4_4_,0xffffffff);
      pFVar21 = extraout_RDX;
      local_c50 = pFVar9;
      do {
        do {
          iVar6 = noncomment_line(buf,(int32)local_c50,pFVar21);
          if (iVar6 < 0) {
            pcVar16 = "Incomplete header\n";
            lVar20 = 0x2c2;
            goto LAB_001149f3;
          }
          iVar7 = __isoc99_sscanf(buf,"%d %s",&n,tag);
          size = n;
          if ((iVar7 != 2) || (n < 0)) {
            pcVar16 = "Error in header: %s\n";
            mdeffile = buf;
            lVar20 = 0x2c5;
            goto LAB_001149ce;
          }
          iVar7 = bcmp(tag,"n_base",7);
          pFVar21 = extraout_RDX_00;
          if (iVar7 != 0) {
            iVar7 = bcmp(tag,"n_tri",6);
            pFVar21 = extraout_RDX_01;
            uVar23 = size;
            uVar28 = uVar29;
            if ((iVar7 != 0) &&
               (iVar7 = bcmp(tag,"n_state_map",0xc), pFVar21 = extraout_RDX_02, uVar23 = uVar24,
               uVar28 = size, iVar7 != 0)) {
              auVar32[0] = -(tag[0] == 'n');
              auVar32[1] = -(tag[1] == '_');
              auVar32[2] = -(tag[2] == 't');
              auVar32[3] = -(tag[3] == 'i');
              auVar32[4] = -(tag[4] == 'e');
              auVar32[5] = -(tag[5] == 'd');
              auVar32[6] = -(tag[6] == '_');
              auVar32[7] = -(tag[7] == 'c');
              auVar32[8] = -(tag[8] == 'i');
              auVar32[9] = -(tag[9] == '_');
              auVar32[10] = -(tag[10] == 's');
              auVar32[0xb] = -(tag[0xb] == 't');
              auVar32[0xc] = -(tag[0xc] == 'a');
              auVar32[0xd] = -(tag[0xd] == 't');
              auVar32[0xe] = -(tag[0xe] == 'e');
              auVar32[0xf] = -(tag[0xf] == '\0');
              if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar32[0xf] >> 7) << 0xf) == 0xffff) {
                m->n_ci_sen = size;
                uVar28 = uVar29;
              }
              else {
                iVar7 = bcmp(tag,"n_tied_state",0xd);
                if (iVar7 == 0) {
                  m->n_sen = size;
                  pFVar21 = extraout_RDX_03;
                  uVar28 = uVar29;
                }
                else {
                  iVar7 = bcmp(tag,"n_tied_tmat",0xc);
                  if (iVar7 != 0) {
                    pcVar16 = "Unknown header line: %s\n";
                    mdeffile = buf;
                    lVar20 = 0x2d4;
                    goto LAB_001149ce;
                  }
                  m->n_tmat = size;
                  pFVar21 = extraout_RDX_04;
                  uVar28 = uVar29;
                }
              }
            }
            size = (uint)local_c68;
            uVar24 = uVar23;
            uVar29 = uVar28;
          }
          local_c68 = (glist_t)CONCAT44(local_c68._4_4_,size);
        } while (((int)(size | uVar24 | uVar29) < 0) || (uVar23 = m->n_ci_sen, (int)uVar23 < 0));
        uVar28 = m->n_sen;
        uVar26 = (ulong)uVar28;
      } while (((int)uVar28 < 0) || (uVar2 = m->n_tmat, (int)uVar2 < 0));
      if ((((uVar23 <= uVar28) && (size != 0)) && (uVar23 != 0)) && (uVar2 != 0)) {
        if (size < 0x7fff) {
          uVar24 = uVar24 + size;
          if (uVar24 < 0x7ffffffe) {
            if (uVar28 < 0x7ffe) {
              if (uVar2 < 0x7ffffffe) {
                uVar26 = 0;
                m->n_emit_state = uVar29 / uVar24 - 1;
                if ((uVar29 / uVar24) * uVar24 == uVar29) {
                  m->n_ciphone = size;
                  phVar10 = hash_table_new(size,0);
                  m->ciphone_ht = phVar10;
                  local_c40 = (char *)(ulong)size;
                  pcVar11 = (ciphone_t *)
                            __ckd_calloc__((size_t)local_c40,0x10,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                           ,0x2f2);
                  m->ciphone = pcVar11;
                  m->n_phone = uVar24;
                  ppVar12 = (phone_t *)
                            __ckd_calloc__((ulong)uVar24,0x20,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                           ,0x2f6);
                  m->phone = ppVar12;
                  ppsVar13 = (s3senid_t **)
                             __ckd_calloc_2d__((long)m->n_phone,(long)m->n_emit_state,2,
                                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                               ,0x2f9);
                  m->sseq = ppsVar13;
                  psVar14 = (s3senid_t *)
                            __ckd_calloc__((long)m->n_emit_state * (long)m->n_phone,2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                           ,0x30d);
                  m->st2senmap = psVar14;
                  uVar22 = (ulong)(uint)m->n_phone;
                  if (m->n_phone < 1) {
                    uVar22 = uVar26;
                  }
                  lVar20 = 0x18;
                  for (; uVar22 != uVar26; uVar26 = uVar26 + 1) {
                    *(s3senid_t **)((long)&m->phone->ssid + lVar20) =
                         psVar14 + (long)(int)uVar26 * (long)m->n_emit_state;
                    lVar20 = lVar20 + 0x20;
                  }
                  ppppVar15 = (ph_lc_t ***)
                              __ckd_calloc_2d__(4,(long)m->n_ciphone,8,
                                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                                ,0x314);
                  m->wpos_ci_lclist = ppppVar15;
                  pFVar21 = extraout_RDX_05;
                  for (pcVar16 = (char *)0x0; pcVar16 != local_c40; pcVar16 = pcVar16 + 1) {
                    iVar6 = noncomment_line(buf,(int32)local_c50,pFVar21);
                    if (iVar6 < 0) {
                      pcVar30 = "Premature EOF reading CIphone %d\n";
                      lVar20 = 0x31e;
                      uVar26 = (ulong)pcVar16 & 0xffffffff;
                      goto LAB_00114b0f;
                    }
                    local_c60 = pcVar16;
                    iVar7 = __isoc99_sscanf(buf,"%s%n",&local_838,&wlen);
                    if (iVar7 != 1) {
                      pcVar16 = "Missing base phone name: %s\n";
                      lVar20 = 0x1ea;
                      mdeffile = buf;
                      goto LAB_001149ce;
                    }
                    lVar20 = (long)wlen;
                    sVar4 = mdef_ciphone_id(m,(char *)&local_838);
                    pcVar30 = local_c60;
                    if (-1 < sVar4) {
                      pcVar16 = "Duplicate base phone: %s\n";
                      lVar20 = 0x1f0;
                      mdeffile = buf;
                      goto LAB_001149ce;
                    }
                    local_c58 = lVar20;
                    if ((long)m->n_ciphone <= (long)local_c60) {
                      __assert_fail("p < m->n_ciphone",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                    ,0xad,"void ciphone_add(mdef_t *, const char *, s3pid_t)");
                    }
                    pcVar16 = __ckd_salloc__((char *)&local_838,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                             ,0xaf);
                    m->ciphone[(long)pcVar30].name = pcVar16;
                    pcVar16 = (char *)hash_table_enter(m->ciphone_ht,pcVar16,pcVar30);
                    if (pcVar16 != pcVar30) {
                      pcVar16 = "hash_table_enter(%s) failed; duplicate CIphone?\n";
                      lVar20 = 0xb2;
                      mdeffile = m->ciphone[(long)pcVar30].name;
                      goto LAB_001149ce;
                    }
                    pcVar30 = buf + local_c58;
                    iVar7 = 3;
                    while( true ) {
                      iVar8 = __isoc99_sscanf(pcVar30,"%s%n",&local_838,&wlen);
                      bVar31 = iVar7 == 0;
                      iVar7 = iVar7 + -1;
                      if (bVar31) break;
                      if ((iVar8 != 1) || ((short)local_838 != 0x2d)) {
                        pcVar16 = "Bad context info for base phone: %s\n";
                        lVar20 = 0x1fa;
                        mdeffile = buf;
                        goto LAB_001149ce;
                      }
                      pcVar30 = pcVar30 + wlen;
                    }
                    if (iVar8 != 1) {
                      pcVar16 = "Missing filler atribute field: %s\n";
                      lVar20 = 0x200;
                      mdeffile = buf;
                      goto LAB_001149ce;
                    }
                    local_c58 = (long)wlen;
                    iVar7 = bcmp(&local_838,"filler",7);
                    pcVar16 = local_c60;
                    iVar6 = 1;
                    if ((iVar7 != 0) && (iVar6 = 0, local_838 != 0x612f6e)) {
                      pcVar16 = "Bad filler attribute field: %s\n";
                      lVar20 = 0x207;
                      mdeffile = buf;
                      goto LAB_001149ce;
                    }
                    m->ciphone[(short)local_c60].filler = iVar6;
                    iVar7 = (int)pcVar30 + (int)local_c58;
                    sVar25 = (s3pid_t)local_c60;
                    triphone_add(m,(short)local_c60,-1,-1,WORD_POSN_UNDEFINED,sVar25);
                    parse_tmat_senmap(m,buf,iVar7 - (int)buf,sVar25);
                    pFVar21 = extraout_RDX_06;
                  }
                  sVar4 = mdef_ciphone_id(m,"SIL");
                  m->sil = sVar4;
                  pFVar21 = extraout_RDX_07;
                  uVar29 = (uint)local_c68;
                  while( true ) {
                    iVar7 = m->n_phone;
                    iVar6 = noncomment_line(buf,(int32)local_c50,pFVar21);
                    pcVar16 = local_c40;
                    if (iVar7 <= (int)uVar29) break;
                    if (iVar6 < 0) {
                      pcVar30 = "Premature EOF reading phone %d\n";
                      lVar20 = 0x326;
                      uVar26 = (ulong)uVar29;
LAB_00114b0f:
                      err_msg(ERR_FATAL,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                              ,lVar20,pcVar30,uVar26);
                      goto LAB_001149d5;
                    }
                    local_c68 = (glist_t)CONCAT44(local_c68._4_4_,uVar29);
                    iVar7 = __isoc99_sscanf(buf,"%s%n",&local_838,&wlen);
                    if (iVar7 != 1) {
                      pcVar16 = "Missing base phone name: %s\n";
                      lVar20 = 0x21d;
                      mdeffile = buf;
                      goto LAB_001149ce;
                    }
                    lVar20 = (long)wlen;
                    sVar4 = mdef_ciphone_id(m,(char *)&local_838);
                    if (sVar4 < 0) {
                      pcVar16 = "Unknown base phone: %s\n";
                      lVar20 = 0x222;
                      mdeffile = buf;
                      goto LAB_001149ce;
                    }
                    pcVar16 = buf + lVar20;
                    iVar7 = __isoc99_sscanf(pcVar16,"%s%n",&local_838,&wlen);
                    if (iVar7 != 1) {
                      pcVar16 = "Missing left context: %s\n";
                      lVar20 = 0x226;
                      mdeffile = buf;
                      goto LAB_001149ce;
                    }
                    lVar20 = (long)wlen;
                    sVar5 = mdef_ciphone_id(m,(char *)&local_838);
                    local_c60 = (char *)CONCAT62(local_c60._2_6_,sVar5);
                    if (sVar5 < 0) {
                      pcVar16 = "Unknown left context: %s\n";
                      lVar20 = 0x22a;
                      mdeffile = buf;
                      goto LAB_001149ce;
                    }
                    pcVar16 = pcVar16 + lVar20;
                    iVar7 = __isoc99_sscanf(pcVar16,"%s%n",&local_838,&wlen);
                    if (iVar7 != 1) {
                      pcVar16 = "Missing right context: %s\n";
                      lVar20 = 0x22e;
                      mdeffile = buf;
                      goto LAB_001149ce;
                    }
                    lVar20 = (long)wlen;
                    sVar5 = mdef_ciphone_id(m,(char *)&local_838);
                    if (sVar5 < 0) {
                      pcVar16 = "Unknown right  context: %s\n";
                      lVar20 = 0x232;
                      mdeffile = buf;
                      goto LAB_001149ce;
                    }
                    pcVar16 = pcVar16 + lVar20;
                    iVar7 = __isoc99_sscanf(pcVar16,"%s%n",&local_838,&wlen);
                    if ((iVar7 != 1) || (local_838._1_1_ != '\0')) {
                      pcVar16 = "Missing or bad word-position spec: %s\n";
                      lVar20 = 0x236;
                      mdeffile = buf;
                      goto LAB_001149ce;
                    }
                    lVar20 = (long)wlen;
                    wpos = WORD_POSN_BEGIN;
                    if ((local_838 & 0xff) != 0x62) {
                      if ((local_838 & 0xff) == 0x73) {
                        wpos = WORD_POSN_SINGLE;
                      }
                      else if ((local_838 & 0xff) == 0x69) {
                        wpos = WORD_POSN_INTERNAL;
                      }
                      else {
                        if ((local_838 & 0xff) != 0x65) {
                          pcVar16 = "Bad word-position spec: %s\n";
                          lVar20 = 0x246;
                          mdeffile = buf;
                          goto LAB_001149ce;
                        }
                        wpos = WORD_POSN_END;
                      }
                    }
                    iVar7 = __isoc99_sscanf(pcVar16 + lVar20,"%s%n",&local_838,&wlen);
                    if (iVar7 != 1) {
                      pcVar16 = "Missing filler attribute field: %s\n";
                      lVar20 = 0x24b;
                      mdeffile = buf;
                      goto LAB_001149ce;
                    }
                    local_c58 = (long)wlen;
                    iVar7 = bcmp(&local_838,"filler",7);
                    if (((iVar7 != 0) || (m->ciphone[(uint)(int)sVar4].filler == 0)) &&
                       ((local_838 != 0x612f6e || (m->ciphone[(uint)(int)sVar4].filler != 0)))) {
                      pcVar16 = "Bad filler attribute field: %s\n";
                      lVar20 = 0x252;
                      mdeffile = buf;
                      goto LAB_001149ce;
                    }
                    iVar7 = (int)(pcVar16 + lVar20) + (int)local_c58;
                    sVar25 = (uint)local_c68;
                    triphone_add(m,sVar4,(s3cipid_t)local_c60,sVar5,wpos,(uint)local_c68);
                    parse_tmat_senmap(m,buf,iVar7 - (int)buf,sVar25);
                    uVar29 = sVar25 + 1;
                    pFVar21 = extraout_RDX_08;
                  }
                  if (-1 < iVar6) {
                    err_msg(ERR_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                            ,0x32c,"Non-empty file beyond expected #phones (%d)\n",
                            (ulong)(uint)m->n_phone);
                  }
                  if (m->n_emit_state * m->n_ciphone == m->n_ci_sen) {
                    psVar14 = (s3senid_t *)
                              __ckd_calloc__((long)m->n_sen,2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                             ,0x333);
                    m->cd2cisen = psVar14;
                    psVar17 = (s3cipid_t *)
                              __ckd_calloc__((long)m->n_sen,2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                             ,0x335);
                    m->sen2cimap = psVar17;
                    uVar22 = 0;
                    uVar26 = (ulong)(uint)m->n_sen;
                    if (m->n_sen < 1) {
                      uVar26 = uVar22;
                    }
                    for (; uVar26 != uVar22; uVar22 = uVar22 + 1) {
                      psVar17[uVar22] = -1;
                    }
                    uVar22 = 0;
                    uVar26 = (ulong)(uint)m->n_ci_sen;
                    if (m->n_ci_sen < 1) {
                      uVar26 = uVar22;
                    }
                    for (; uVar26 != uVar22; uVar22 = uVar22 + 1) {
                      m->cd2cisen[uVar22] = (s3senid_t)uVar22;
                      psVar17[uVar22] =
                           (s3cipid_t)
                           ((long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | uVar22 & 0xffffffff)
                           / (long)m->n_emit_state);
                    }
                    iVar7 = m->n_phone;
                    for (; (int)pcVar16 < iVar7; pcVar16 = pcVar16 + 1) {
                      uVar29 = m->n_emit_state;
                      if (m->n_emit_state < 1) {
                        uVar29 = 0;
                      }
                      for (uVar26 = 0; uVar29 != uVar26; uVar26 = uVar26 + 1) {
                        ppVar12 = m->phone;
                        sVar1 = m->sseq[(long)pcVar16][uVar26];
                        m->cd2cisen[sVar1] = m->sseq[ppVar12[(long)pcVar16].ci][uVar26];
                        psVar17[sVar1] = ppVar12[(long)pcVar16].ci;
                      }
                    }
                    iVar8 = m->n_emit_state;
                    lVar20 = 0;
                    phVar10 = hash_table_new(iVar7,0);
                    __n = (size_t)(iVar8 * 2);
                    uVar29 = 0;
                    for (lVar27 = 0; lVar27 < m->n_phone; lVar27 = lVar27 + 1) {
                      pvVar18 = hash_table_enter_bkey
                                          (phVar10,(char *)m->sseq[lVar27],__n,(void *)(ulong)uVar29
                                          );
                      local_838 = (uint)pvVar18;
                      uVar29 = uVar29 + (uVar29 == local_838);
                      *(uint *)((long)&m->phone->ssid + lVar20) = local_838;
                      lVar20 = lVar20 + 0x20;
                    }
                    ppsVar13 = (s3senid_t **)
                               __ckd_calloc_2d__((size_t)(ulong)uVar29,(long)m->n_emit_state,2,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                                 ,0x277);
                    pgVar19 = hash_table_tolist(phVar10,&local_838);
                    pgVar3 = pgVar19;
                    if (local_838 != uVar29) {
                      __assert_fail("j == n_sseq",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                                    ,0x27a,"void sseq_compress(mdef_t *)");
                    }
                    for (; local_c68 = pgVar3, pgVar19 != (glist_t)0x0; pgVar19 = pgVar19->next) {
                      local_838 = (uint)*(undefined8 *)((long)(pgVar19->data).ptr + 0x10);
                      memcpy(ppsVar13[(int)local_838],*(pgVar19->data).ptr,__n);
                      pgVar3 = local_c68;
                    }
                    glist_free(local_c68);
                    ckd_free_2d(m->sseq);
                    m->sseq = ppsVar13;
                    m->n_sseq = uVar29;
                    hash_table_free(phVar10);
                    fclose(local_c50);
                    return m;
                  }
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                          ,0x332,"#CI-senones(%d) != #CI-phone(%d) x #emitting-states(%d)\n",
                          (ulong)(uint)m->n_ci_sen,(ulong)(uint)m->n_ciphone,m->n_emit_state);
                  goto LAB_001149d5;
                }
                pcVar16 = "Header error: n_state_map not a multiple of n_ci*n_tri\n";
                lVar20 = 0x2ed;
                goto LAB_001149f3;
              }
              uVar33 = 0x7ffffffe;
              pcVar16 = "%s: #tmats (%d) exceeds limit (%d)\n";
              lVar20 = 0x2e8;
              uVar26 = (ulong)uVar2;
            }
            else {
              uVar33 = 0x7ffe;
              pcVar16 = "%s: #senones (%d) exceeds limit (%d)\n";
              lVar20 = 0x2e5;
            }
          }
          else {
            uVar33 = 0x7ffffffe;
            pcVar16 = "%s: #Phones (%d) exceeds limit (%d)\n";
            lVar20 = 0x2e2;
            uVar26 = (ulong)uVar24;
          }
        }
        else {
          uVar33 = 0x7fff;
          pcVar16 = "%s: #CI phones (%d) exceeds limit (%d)\n";
          lVar20 = 0x2df;
          uVar26 = (ulong)size;
        }
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                ,lVar20,pcVar16,local_c60,uVar26,uVar33);
        goto LAB_001149d5;
      }
      pcVar16 = "%s: Error in header\n";
      lVar20 = 0x2da;
      mdeffile = local_c60;
    }
LAB_001149ce:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
            ,lVar20,pcVar16,mdeffile);
  }
LAB_001149d5:
  exit(1);
}

Assistant:

mdef_t *
mdef_init(const char *mdeffile, int32 breport)
{
    FILE *fp;
    int32 n_ci, n_tri, n_map, n;
    char tag[1024], buf[1024];
    s3senid_t **senmap;
    /*    s3senid_t *tempsenmap; */

    s3pid_t p;
    int32 s, ci, cd;
    mdef_t *m;

    if (!mdeffile)
        E_FATAL("No mdef-file\n");

    if (breport)
        E_INFO("Reading model definition: %s\n", mdeffile);

    m = (mdef_t *) ckd_calloc(1, sizeof(mdef_t));       /* freed in mdef_free */

    if ((fp = fopen(mdeffile, "r")) == NULL)
        E_FATAL_SYSTEM("fopen(%s,r) failed\n", mdeffile);

    if (noncomment_line(buf, sizeof(buf), fp) < 0)
        E_FATAL("Empty file: %s\n", mdeffile);

    if (strncmp(buf, MODEL_DEF_VERSION, strlen(MODEL_DEF_VERSION)) != 0)
        E_FATAL("Version error: Expecing %s, but read %s\n",
                MODEL_DEF_VERSION, buf);

    /* Read #base phones, #triphones, #senone mappings defined in header */
    n_ci = -1;
    n_tri = -1;
    n_map = -1;
    m->n_ci_sen = -1;
    m->n_sen = -1;
    m->n_tmat = -1;
    do {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Incomplete header\n");

        if ((sscanf(buf, "%d %s", &n, tag) != 2) || (n < 0))
            E_FATAL("Error in header: %s\n", buf);

        if (strcmp(tag, "n_base") == 0)
            n_ci = n;
        else if (strcmp(tag, "n_tri") == 0)
            n_tri = n;
        else if (strcmp(tag, "n_state_map") == 0)
            n_map = n;
        else if (strcmp(tag, "n_tied_ci_state") == 0)
            m->n_ci_sen = n;
        else if (strcmp(tag, "n_tied_state") == 0)
            m->n_sen = n;
        else if (strcmp(tag, "n_tied_tmat") == 0)
            m->n_tmat = n;
        else
            E_FATAL("Unknown header line: %s\n", buf);
    } while ((n_ci < 0) || (n_tri < 0) || (n_map < 0) ||
             (m->n_ci_sen < 0) || (m->n_sen < 0) || (m->n_tmat < 0));

    if ((n_ci == 0) || (m->n_ci_sen == 0) || (m->n_tmat == 0)
        || (m->n_ci_sen > m->n_sen))
        E_FATAL("%s: Error in header\n", mdeffile);

    /* Check typesize limits */
    if (n_ci >= MAX_S3CIPID)
        E_FATAL("%s: #CI phones (%d) exceeds limit (%d)\n", mdeffile, n_ci,
                MAX_S3CIPID);
    if (n_ci + n_tri >= MAX_S3PID)
        E_FATAL("%s: #Phones (%d) exceeds limit (%d)\n", mdeffile,
                n_ci + n_tri, MAX_S3PID);
    if (m->n_sen >= MAX_S3SENID)
        E_FATAL("%s: #senones (%d) exceeds limit (%d)\n", mdeffile,
                m->n_sen, MAX_S3SENID);
    if (m->n_tmat >= MAX_S3TMATID)
        E_FATAL("%s: #tmats (%d) exceeds limit (%d)\n", mdeffile,
                m->n_tmat, MAX_S3TMATID);

    m->n_emit_state = (n_map / (n_ci + n_tri)) - 1;
    if ((m->n_emit_state + 1) * (n_ci + n_tri) != n_map)
        E_FATAL
            ("Header error: n_state_map not a multiple of n_ci*n_tri\n");

    /* Initialize ciphone info */
    m->n_ciphone = n_ci;
    m->ciphone_ht = hash_table_new(n_ci, HASH_CASE_YES);  /* With case-insensitive string names *//* freed in mdef_free */
    m->ciphone = (ciphone_t *) ckd_calloc(n_ci, sizeof(ciphone_t));     /* freed in mdef_free */

    /* Initialize phones info (ciphones + triphones) */
    m->n_phone = n_ci + n_tri;
    m->phone = (phone_t *) ckd_calloc(m->n_phone, sizeof(phone_t));     /* freed in mdef_free */

    /* Allocate space for state->senone map for each phone */
    senmap = (s3senid_t **) ckd_calloc_2d(m->n_phone, m->n_emit_state, sizeof(s3senid_t));      /* freed in mdef_free */
    m->sseq = senmap;           /* TEMPORARY; until it is compressed into just the unique ones */


    /**CODE DUPLICATION!*****************************************************************************************************/
    /* Flat decoder-specific */
    /* Allocate space for state->senone map for each phone */

    /* ARCHAN 20040820, this sacrifice readability and may cause pointer
       problems in future. However, this is a less evil than
       duplication of code.  This is trick point all the state mapping
       to the global mapping and avoid duplicated memory.  
     */

    /* S3 xwdpid_compress will compress the below list phone list. 
     */

    /* ARCHAN, this part should not be used when one of the recognizer is used. */
    m->st2senmap =
        (s3senid_t *) ckd_calloc(m->n_phone * m->n_emit_state,
                                 sizeof(s3senid_t));
    for (p = 0; p < m->n_phone; p++)
        m->phone[p].state = m->st2senmap + (p * m->n_emit_state);
    /******************************************************************************************************/


    /* Allocate initial space for <ci,lc,rc,wpos> -> pid mapping */
    m->wpos_ci_lclist = (ph_lc_t ***) ckd_calloc_2d(N_WORD_POSN, m->n_ciphone, sizeof(ph_lc_t *));      /* freed in mdef_free */

    /*
     * Read base phones and triphones.  They'll simply be assigned a running sequence
     * number as their "phone-id".  If the phone-id < n_ci, it's a ciphone.
     */

    /* Read base phones */
    for (p = 0; p < n_ci; p++) {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Premature EOF reading CIphone %d\n", p);
        parse_base_line(m, buf, p);
    }
    m->sil = mdef_ciphone_id(m, S3_SILENCE_CIPHONE);

    /* Read triphones, if any */
    for (; p < m->n_phone; p++) {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Premature EOF reading phone %d\n", p);
        parse_tri_line(m, buf, p);
    }

    if (noncomment_line(buf, sizeof(buf), fp) >= 0)
        E_ERROR("Non-empty file beyond expected #phones (%d)\n",
                m->n_phone);

    /* Build CD senones to CI senones map */
    if (m->n_ciphone * m->n_emit_state != m->n_ci_sen)
        E_FATAL
            ("#CI-senones(%d) != #CI-phone(%d) x #emitting-states(%d)\n",
             m->n_ci_sen, m->n_ciphone, m->n_emit_state);
    m->cd2cisen = (s3senid_t *) ckd_calloc(m->n_sen, sizeof(s3senid_t));        /* freed in mdef_free */

    m->sen2cimap = (s3cipid_t *) ckd_calloc(m->n_sen, sizeof(s3cipid_t));       /* freed in mdef_free */

    for (s = 0; s < m->n_sen; s++)
        m->sen2cimap[s] = BAD_S3CIPID;
    for (s = 0; s < m->n_ci_sen; s++) { /* CI senones */
        m->cd2cisen[s] = (s3senid_t) s;
        m->sen2cimap[s] = s / m->n_emit_state;
    }
    for (p = n_ci; p < m->n_phone; p++) {       /* CD senones */
        for (s = 0; s < m->n_emit_state; s++) {
            cd = m->sseq[p][s];
            ci = m->sseq[(int) m->phone[p].ci][s];
            m->cd2cisen[cd] = (s3senid_t) ci;
            m->sen2cimap[cd] = m->phone[p].ci;
        }
    }

    sseq_compress(m);
    fclose(fp);

    return m;
}